

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall
Omega_h::limit_gradation_once_tmpl<2,1>(Omega_h *this,Mesh *mesh,Reals *values,Real max_rate)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  Alloc *pAVar3;
  LO LVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  Reals RVar6;
  Write<double> out;
  Reals coords;
  type f;
  Graph v2v;
  undefined1 local_f8 [32];
  Alloc *local_d8;
  void *local_d0;
  Write<double> local_c8;
  Alloc *local_b8;
  element_type *local_b0;
  type local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Graph local_48;
  
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)max_rate;
  Mesh::ask_star(&local_48,mesh,0);
  Mesh::coords((Mesh *)&local_b8);
  LVar4 = Mesh::nverts(mesh);
  local_a8.values.write_.shared_alloc_.alloc = (Alloc *)&local_a8.coords;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  Write<double>::Write((Write<double> *)(local_f8 + 0x10),LVar4,(string *)&local_a8);
  if (local_a8.values.write_.shared_alloc_.alloc != (Alloc *)&local_a8.coords) {
    operator_delete(local_a8.values.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_a8.coords.write_.shared_alloc_.alloc)->size)->_M_ptr
                           + 1));
  }
  local_a8.values.write_.shared_alloc_.alloc = (values->write_).shared_alloc_.alloc;
  if (((ulong)local_a8.values.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.values.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.values.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.values.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.values.write_.shared_alloc_.alloc)->use_count =
           (local_a8.values.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.values.write_.shared_alloc_.direct_ptr = (values->write_).shared_alloc_.direct_ptr;
  local_a8.coords.write_.shared_alloc_.alloc = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.coords.write_.shared_alloc_.alloc = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_a8.coords.write_.shared_alloc_.direct_ptr = local_b0;
  local_a8.v2v.a2ab.write_.shared_alloc_.alloc = local_48.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_48.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.v2v.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_48.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.v2v.a2ab.write_.shared_alloc_.direct_ptr = local_48.a2ab.write_.shared_alloc_.direct_ptr;
  local_a8.v2v.ab2b.write_.shared_alloc_.alloc = local_48.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_48.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.v2v.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_48.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.v2v.ab2b.write_.shared_alloc_.direct_ptr = local_48.ab2b.write_.shared_alloc_.direct_ptr;
  local_a8.max_rate = (Real)local_50._M_pi;
  local_a8.out.shared_alloc_.alloc = (Alloc *)local_f8._16_8_;
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.out.shared_alloc_.alloc = (Alloc *)((long)*(_func_int ***)local_f8._16_8_ * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_a8.out.shared_alloc_.direct_ptr = (void *)local_f8._24_8_;
  LVar4 = Mesh::nverts(mesh);
  parallel_for<Omega_h::limit_gradation_once_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<double>,double)::_lambda(int)_1_>
            (LVar4,&local_a8,"limit_metric_gradation");
  local_c8.shared_alloc_.alloc = (Alloc *)local_f8._16_8_;
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.shared_alloc_.alloc = (Alloc *)((long)*(_func_int ***)local_f8._16_8_ * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_c8.shared_alloc_.direct_ptr = (void *)local_f8._24_8_;
  Read<double>::Read((Read<signed_char> *)local_f8,&local_c8);
  pAVar3 = (values->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar2 = &pAVar3->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_c8.shared_alloc_.alloc;
  (values->write_).shared_alloc_.alloc = (Alloc *)local_f8._0_8_;
  (values->write_).shared_alloc_.direct_ptr = (void *)local_f8._8_8_;
  if (((local_f8._0_8_ & 7) == 0 && (Alloc *)local_f8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_f8._0_8_ + 0x30) = *(int *)(local_f8._0_8_ + 0x30) + -1;
    (values->write_).shared_alloc_.alloc = (Alloc *)(*(size_t *)local_f8._0_8_ * 8 + 1);
  }
  local_f8._0_8_ = (Alloc *)0x0;
  local_f8._8_8_ = (element_type *)0x0;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_d8 = (values->write_).shared_alloc_.alloc;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  local_d0 = (values->write_).shared_alloc_.direct_ptr;
  Mesh::sync_array<double>((Mesh *)local_f8,(Int)mesh,(Read<double> *)0x0,(Int)&local_d8);
  pAVar3 = (values->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar2 = &pAVar3->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_d8;
  (values->write_).shared_alloc_.alloc = (Alloc *)local_f8._0_8_;
  (values->write_).shared_alloc_.direct_ptr = (void *)local_f8._8_8_;
  if (((local_f8._0_8_ & 7) == 0 && (Alloc *)local_f8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_f8._0_8_ + 0x30) = *(int *)(local_f8._0_8_ + 0x30) + -1;
    (values->write_).shared_alloc_.alloc = (Alloc *)(*(size_t *)local_f8._0_8_ * 8 + 1);
  }
  local_f8._0_8_ = (Alloc *)0x0;
  local_f8._8_8_ = (element_type *)0x0;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar2 = &local_d8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = (values->write_).shared_alloc_.alloc;
  *(Alloc **)this = pAVar3;
  *(void **)(this + 8) = (values->write_).shared_alloc_.direct_ptr;
  if ((((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    pAVar3->use_count = pAVar3->use_count + -1;
    *(size_t *)this = pAVar3->size * 8 + 1;
  }
  (values->write_).shared_alloc_.alloc = (Alloc *)0x0;
  (values->write_).shared_alloc_.direct_ptr = (void *)0x0;
  limit_gradation_once_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<double>,double)::{lambda(int)#1}::
  ~Mesh((_lambda_int__1_ *)&local_a8);
  pvVar5 = extraout_RDX;
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x30);
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_f8._16_8_);
      operator_delete((void *)local_f8._16_8_,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar2 = &local_b8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  if (((ulong)local_48.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_48.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_48.ab2b.write_.shared_alloc_.alloc);
      operator_delete(local_48.ab2b.write_.shared_alloc_.alloc,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  if (((ulong)local_48.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_48.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_48.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_48.a2ab.write_.shared_alloc_.alloc,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals limit_gradation_once_tmpl(
    Mesh* mesh, Reals values, Real max_rate) {
  auto v2v = mesh->ask_star(VERT);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(metric_dim));
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto m = get_symm<metric_dim>(values, v);
    auto x = get_vector<mesh_dim>(coords, v);
    for (auto vv = v2v.a2ab[v]; vv < v2v.a2ab[v + 1]; ++vv) {
      auto av = v2v.ab2b[vv];
      auto am = get_symm<metric_dim>(values, av);
      auto ax = get_vector<mesh_dim>(coords, av);
      auto vec = ax - x;
      auto metric_dist = metric_length(am, vec);
      auto factor = metric_eigenvalue_from_length(1.0 + metric_dist * max_rate);
      auto limiter = am * factor;
      auto limited = intersect_metrics(m, limiter);
      m = limited;
    }
    set_symm(out, v, m);
  };
  parallel_for(mesh->nverts(), f, "limit_metric_gradation");
  values = Reals(out);
  values = mesh->sync_array(VERT, values, symm_ncomps(metric_dim));
  return values;
}